

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

void absl::lts_20250127::cord_internal::CordRepBtree::Rebuild
               (CordRepBtree **stack,CordRepBtree *tree,bool consume)

{
  byte bVar1;
  byte bVar2;
  size_t delta;
  CordRepBtree *pCVar3;
  CordRep **ppCVar4;
  CordRep *rep;
  CordRepBtree *pCVar5;
  undefined7 in_register_00000011;
  long lVar6;
  CordRepBtree **ppCVar7;
  CordRepBtree *back;
  bool consume_00;
  bool bVar8;
  OpResult OVar9;
  
  if ((int)CONCAT71(in_register_00000011,consume) == 0) {
    consume_00 = false;
  }
  else {
    consume_00 = (tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2;
  }
  bVar1 = (tree->super_CordRep).storage[1];
  bVar2 = (tree->super_CordRep).storage[2];
  if ((tree->super_CordRep).storage[0] != '\0') {
    for (lVar6 = (ulong)bVar1 << 3; (ulong)bVar2 * 8 != lVar6; lVar6 = lVar6 + 8) {
      pCVar3 = CordRep::btree(*(CordRep **)((long)tree->edges_ + lVar6));
      Rebuild(stack,pCVar3,consume_00);
    }
LAB_00d0a683:
    if (!consume) {
      return;
    }
    if (consume_00 == false) {
      CordRep::Unref(&tree->super_CordRep);
      return;
    }
    Delete(tree);
    return;
  }
  ppCVar4 = tree->edges_ + bVar1;
LAB_00d0a5c3:
  if (ppCVar4 != tree->edges_ + bVar2) {
    rep = *ppCVar4;
    if (consume_00 == false) {
      rep = CordRep::Ref(rep);
    }
    delta = rep->length;
    pCVar3 = *stack;
    OVar9 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                      (pCVar3,true,rep,delta);
    lVar6 = 0;
    do {
      back = OVar9.tree;
      bVar8 = OVar9.action == kPopped;
      ppCVar7 = stack + lVar6 + 1;
      while( true ) {
        if (!bVar8) goto LAB_00d0a663;
        stack[lVar6] = back;
        pCVar5 = stack[lVar6 + 1];
        if (pCVar5 != (CordRepBtree *)0x0) break;
        pCVar5 = New(pCVar3,back);
        stack[lVar6 + 1] = pCVar5;
        lVar6 = lVar6 + 1;
        ppCVar7 = ppCVar7 + 1;
        bVar8 = false;
      }
      OVar9 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                        (pCVar5,true,&back->super_CordRep,delta);
      lVar6 = lVar6 + 1;
      pCVar3 = pCVar5;
    } while( true );
  }
  goto LAB_00d0a683;
LAB_00d0a663:
  for (; pCVar3 = *ppCVar7, pCVar3 != (CordRepBtree *)0x0; ppCVar7 = ppCVar7 + 1) {
    (pCVar3->super_CordRep).length = (pCVar3->super_CordRep).length + delta;
  }
  ppCVar4 = ppCVar4 + 1;
  goto LAB_00d0a5c3;
}

Assistant:

void CordRepBtree::Rebuild(CordRepBtree** stack, CordRepBtree* tree,
                           bool consume) {
  bool owned = consume && tree->refcount.IsOne();
  if (tree->height() == 0) {
    for (CordRep* edge : tree->Edges()) {
      if (!owned) edge = CordRep::Ref(edge);
      size_t height = 0;
      size_t length = edge->length;
      CordRepBtree* node = stack[0];
      OpResult result = node->AddEdge<kBack>(true, edge, length);
      while (result.action == CordRepBtree::kPopped) {
        stack[height] = result.tree;
        if (stack[++height] == nullptr) {
          result.action = CordRepBtree::kSelf;
          stack[height] = CordRepBtree::New(node, result.tree);
        } else {
          node = stack[height];
          result = node->AddEdge<kBack>(true, result.tree, length);
        }
      }
      while (stack[++height] != nullptr) {
        stack[height]->length += length;
      }
    }
  } else {
    for (CordRep* rep : tree->Edges()) {
      Rebuild(stack, rep->btree(), owned);
    }
  }
  if (consume) {
    if (owned) {
      CordRepBtree::Delete(tree);
    } else {
      CordRepBtree::Unref(tree);
    }
  }
}